

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QPixmap>::moveAppend
          (QGenericArrayOps<QPixmap> *this,QPixmap *b,QPixmap *e)

{
  qsizetype *pqVar1;
  QPixmap *pQVar2;
  QPlatformPixmap *pQVar3;
  QPixmap *this_00;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QPixmap>).ptr;
    do {
      this_00 = pQVar2 + (this->super_QArrayDataPointer<QPixmap>).size;
      QPaintDevice::QPaintDevice(&this_00->super_QPaintDevice);
      (this_00->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007e3618;
      pQVar3 = (b->data).d.ptr;
      (b->data).d.ptr = (QPlatformPixmap *)0x0;
      (this_00->data).d.ptr = pQVar3;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QPixmap>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }